

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Var::copy_meta_data(Var *this,Var *new_var,bool check_param)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Var *pVVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  UserException *this_00;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_RCX;
  char (*format_str) [104];
  v7 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view format_str_01;
  string_view format_str_02;
  v7 local_1b8 [32];
  string local_198;
  string local_178;
  Param *local_158;
  Param *parent_param;
  Var *new_v_1;
  type *v;
  type *index;
  _Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false> local_130;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
  *__range1;
  Var *new_v;
  bool check_param_local;
  Var *new_var_local;
  Var *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_f0;
  basic_string_view<char> local_e8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_d8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_c0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *vargs_1;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_68;
  string *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_00;
  
  if (this->width_param_ != (Var *)0x0) {
    pVVar4 = this->width_param_;
    iVar2 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])();
    pVVar4 = copy_var_const_parm(pVVar4,(Generator *)CONCAT44(extraout_var,iVar2),check_param);
    (*(new_var->super_IRNode)._vptr_IRNode[0x23])(new_var,pVVar4);
  }
  __end1 = std::
           unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
           ::begin(&this->size_param_);
  local_130._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>
       ::end(&this->size_param_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_kratos::Var_*>,_false>
                            ,&local_130), bVar1) {
    index = &std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>::
             operator*(&__end1)->first;
    v = (type *)std::get<0ul,unsigned_int_const,kratos::Var*>
                          ((pair<const_unsigned_int,_kratos::Var_*> *)index);
    new_v_1 = (Var *)std::get<1ul,unsigned_int_const,kratos::Var*>
                               ((pair<const_unsigned_int,_kratos::Var_*> *)index);
    pVVar4 = (Var *)(new_v_1->super_IRNode)._vptr_IRNode;
    iVar2 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])();
    parent_param = (Param *)copy_var_const_parm(pVVar4,(Generator *)CONCAT44(extraout_var_00,iVar2),
                                                check_param);
    set_size_param(new_var,*(uint32_t *)v,(Var *)parent_param);
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>
    ::operator++(&__end1);
  }
  if (this->raw_type_param_ == (Param *)0x0) {
    return;
  }
  local_158 = Param::parent_param(this->raw_type_param_);
  if (local_158 != (Param *)0x0) {
    iVar2 = (*(local_158->super_Const).super_Var.super_IRNode._vptr_IRNode[0xd])();
    iVar3 = (*(new_var->super_IRNode)._vptr_IRNode[0xd])();
    in_RCX = (remove_reference_t<std::__cxx11::basic_string<char>_> *)
             CONCAT44(extraout_var_02,iVar3);
    if ((remove_reference_t<std::__cxx11::basic_string<char>_> *)CONCAT44(extraout_var_01,iVar2) ==
        in_RCX) {
      new_var->raw_type_param_ = local_158;
      return;
    }
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  (*(this->super_IRNode)._vptr_IRNode[0x1f])(local_1b8);
  local_60 = &local_198;
  local_68 = 
  "Unable to copy var definition since the width parametrization is set to different generator for var {0}"
  ;
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_1b8;
  local_88.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string,char[104],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)
                  "Unable to copy var definition since the width parametrization is set to different generator for var {0}"
                  ,(v7 *)vargs,format_str,in_RCX);
  local_78 = &local_88;
  local_98 = fmt::v7::to_string_view<char,_0>(local_68);
  local_50 = &local_a8;
  local_58 = local_78;
  local_48 = local_78;
  local_38 = local_78;
  local_40 = local_50;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_50,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_78->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_a8.field_1.values_;
  format_str_01.size_ = local_a8.desc_;
  format_str_01.data_ = (char *)local_98.size_;
  this_01 = (v7 *)local_98.data_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_198,(detail *)local_98.data_,format_str_01,args);
  local_b0 = &local_178;
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)&local_198;
  local_d8.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<,std::__cxx11::string,char>(vargs_1,this_01,format_str_00);
  local_c0 = &local_d8;
  local_e8 = fmt::v7::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vargs_1
                       );
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_c0;
  local_20 = local_c0;
  local_10 = local_c0;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_c0->string);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_f0.values_;
  format_str_02.size_ = (size_t)this_local;
  format_str_02.data_ = (char *)local_e8.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_178,(detail *)local_e8.data_,format_str_02,args_00);
  UserException::UserException(this_00,&local_178);
  __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
}

Assistant:

void Var::copy_meta_data(Var *new_var, bool check_param) const {
    // basically the parameters
    if (width_param_) {
        auto &new_v = copy_var_const_parm(width_param_, new_var->generator(), check_param);
        new_var->set_width_param(&new_v);
    }
    // need to copy size as well
    // notice that size parameters are actually expressions, so we need to copy all the expressions
    // over using ast visitor
    for (const auto &[index, v] : size_param_) {
        auto &new_v = copy_var_const_parm(v, new_var->generator(), check_param);
        new_var->set_size_param(index, &new_v);
    }

    // need to copy the raw_param as well
    if (raw_type_param_) {
        const auto *parent_param = raw_type_param_->parent_param();
        if (!parent_param || parent_param->generator() != new_var->generator()) {
            throw UserException(::format(
                ::format("Unable to copy var definition since the width parametrization is set to "
                         "different generator for var {0}",
                         to_string())));
        }
        new_var->raw_type_param_ = const_cast<Param *>(parent_param);
    }
}